

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3.cpp
# Opt level: O1

Vector3 * __thiscall
Vector3::refracted(Vector3 *__return_storage_ptr__,Vector3 *this,Vector3 *N,double n,
                  bool *isRefracted)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  
  dVar3 = N->z * N->z + N->x * N->x + N->y * N->y;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  if (1e-05 < ABS(dVar3 + -1.0)) {
    __assert_fail("!sign(N.len() - 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lazycal[P]Progressive-Photon-Mapping/Vector3.cpp"
                  ,0x93,"Vector3 Vector3::refracted(const Vector3 &, double, bool &) const");
  }
  dVar3 = this->z * this->z + this->x * this->x + this->y * this->y;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  if (ABS(dVar3 + -1.0) <= 1e-05) {
    auVar5._0_8_ = this->x;
    auVar5._8_8_ = this->y;
    dVar3 = this->z;
    dVar6 = (-(double)auVar5._0_8_ * N->x - (double)auVar5._8_8_ * N->y) - N->z * dVar3;
    dVar4 = ((1.0 - dVar6 * dVar6) / n) / n;
    *isRefracted = false;
    if (dVar4 <= 1.0) {
      dVar4 = 1.0 - dVar4;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      *isRefracted = true;
      auVar1._8_8_ = n;
      auVar1._0_8_ = n;
      auVar5 = divpd(auVar5,auVar1);
      dVar4 = dVar4 - dVar6 / n;
      dVar6 = N->z;
      dVar2 = N->y;
      __return_storage_ptr__->x = auVar5._0_8_ - dVar4 * N->x;
      __return_storage_ptr__->y = auVar5._8_8_ - dVar4 * dVar2;
      __return_storage_ptr__->z = dVar3 / n - dVar6 * dVar4;
    }
    else {
      reflected(__return_storage_ptr__,this,N);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("!sign(len() - 1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lazycal[P]Progressive-Photon-Mapping/Vector3.cpp"
                ,0x94,"Vector3 Vector3::refracted(const Vector3 &, double, bool &) const");
}

Assistant:

Vector3 Vector3::refracted(const Vector3 &N, double n, bool &isRefracted) const{
#ifdef DEBUG
    assert(!sign(N.len() - 1));
    assert(!sign(len() - 1));
#endif
    Vector3 V = -*this;
    double cos1 = N.dot(V), sin22 = (1 - cos1 * cos1)/n/n;
    isRefracted = 0;
    if (sin22 > 1) return reflected(N);
    double cos2 = sqrt(1 - sin22);
    isRefracted = 1;
    return -V/n - (cos2 - cos1/n) * N;
}